

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O3

void Pdr_InvPrint(Vec_Int_t *vInv,int fVerbose)

{
  int iVar1;
  uint uVar2;
  char *__ptr;
  uint uVar3;
  Vec_Int_t *pVVar4;
  Vec_Str_t *__ptr_00;
  
  iVar1 = vInv->nSize;
  if (iVar1 < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar2 = *vInv->pArray;
  pVVar4 = vInv;
  uVar3 = Pdr_InvUsedFlopNum(vInv);
  if (0 < (long)vInv->nSize) {
    Abc_Print((int)pVVar4,
              "Invariant contains %d clauses with %d literals and %d flops (out of %d).\n",
              (ulong)uVar2,(ulong)((iVar1 - uVar2) - 2),(ulong)uVar3,
              (ulong)(uint)vInv->pArray[(long)vInv->nSize + -1]);
    if (fVerbose != 0) {
      pVVar4 = Pdr_InvCounts(vInv);
      __ptr_00 = Pdr_InvPrintStr(vInv,pVVar4);
      __ptr = __ptr_00->pArray;
      Abc_Print((int)vInv,"%s",__ptr);
      if (pVVar4->pArray != (int *)0x0) {
        free(pVVar4->pArray);
      }
      free(pVVar4);
      if (__ptr != (char *)0x0) {
        free(__ptr);
      }
      free(__ptr_00);
      return;
    }
    return;
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
}

Assistant:

void Pdr_InvPrint( Vec_Int_t * vInv, int fVerbose )
{
    Abc_Print(1, "Invariant contains %d clauses with %d literals and %d flops (out of %d).\n", Vec_IntEntry(vInv, 0), Vec_IntSize(vInv)-Vec_IntEntry(vInv, 0)-2, Pdr_InvUsedFlopNum(vInv), Vec_IntEntryLast(vInv) );
    if ( fVerbose )
    {
        Vec_Int_t * vCounts = Pdr_InvCounts( vInv );
        Vec_Str_t * vStr = Pdr_InvPrintStr( vInv, vCounts );
        Abc_Print(1, "%s", Vec_StrArray( vStr ) );
        Vec_IntFree( vCounts );
        Vec_StrFree( vStr );
    }
}